

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O2

float __thiscall
ltc::evaluate(ltc *this,vec3 *light_dir,vec3 *view_dir,float *probability_density_function)

{
  ostream *poVar1;
  logic_error *this_00;
  float fVar2;
  float fVar3;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_68;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_58;
  mat3 local_4c;
  
  get_framed_ltc_matrix_inv(&local_4c,this);
  local_68.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
        )glm::operator*(&local_4c,light_dir);
  local_58.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
        )glm::detail::compute_normalize<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                   ((vec<3,_float,_(glm::precision)0> *)&local_68.field_0);
  get_framed_ltc_matrix(&local_4c,this);
  local_68.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
        )glm::operator*(&local_4c,(row_type *)&local_58.field_0);
  fVar2 = glm::detail::compute_length<glm::vec,_3,_float,_(glm::precision)0,_false>::call
                    ((vec<3,_float,_(glm::precision)0> *)&local_68.field_0);
  if (fVar2 < 1e-08) {
    poVar1 = log_error();
    poVar1 = std::operator<<(poVar1,
                             "Transformed light direction to original space is degenerated (with length = 0)."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Transformed light direction is degenerated");
  }
  else {
    get_framed_ltc_matrix(&local_4c,this);
    fVar3 = glm::detail::compute_determinant<glm::mat,_3,_3,_float,_(glm::precision)0,_false>::call
                      (&local_4c);
    fVar3 = fVar3 / (fVar2 * fVar2 * fVar2);
    if (!NAN(fVar3)) {
      if (local_58.field_0.z <= 0.0) {
        local_58.field_0.z = 0.0;
      }
      fVar3 = (local_58.field_0.z / 3.1415927) / fVar3;
      fVar2 = this->_amplitude;
      *probability_density_function = fVar3;
      return fVar2 * fVar3;
    }
    poVar1 = log_error();
    poVar1 = std::operator<<(poVar1,"LTC Jacobian is NaN. Aborting.");
    std::endl<char,std::char_traits<char>>(poVar1);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Jacobian is NaN");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

float ltc::evaluate(
  const glm::vec3 &light_dir,
  const glm::vec3 &view_dir,
  float &probability_density_function
) const
{
  // here 'original' means original clamped cosine distribution 'space'
  glm::vec3 original_light_dir = glm::normalize(get_framed_ltc_matrix_inv() * light_dir);
  auto len = glm::length(get_framed_ltc_matrix() * original_light_dir);

  const float MIN_TRANSFORMED_LENGTH = 0.00000001f;
  if (len < MIN_TRANSFORMED_LENGTH)
  {
    log_error() << "Transformed light direction to original space is degenerated (with length = 0)." << std::endl;
    throw std::logic_error("Transformed light direction is degenerated");
  }

  auto jacobian = glm::determinant(get_framed_ltc_matrix()) / (len * len * len);

  if (std::isnan(jacobian))
  {
    log_error() << "LTC Jacobian is NaN. Aborting." << std::endl;
    throw std::logic_error("Jacobian is NaN");
  }

  float d = std::max(0.0f, original_light_dir.z) / pi / jacobian;
  float result = _amplitude * d;

  probability_density_function = d;

  return result;
}